

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationGeometryPassthroughTests.cpp
# Opt level: O1

string * vkt::tessellation::anon_unknown_2::generateTessellationEvaluationShader
                   (string *__return_storage_ptr__,TessPrimitiveType primitiveType,
                   string *colorOutputName)

{
  bool bVar1;
  char *pcVar2;
  size_t sVar3;
  ostream *poVar4;
  long lVar5;
  ostringstream src;
  long local_198 [14];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  pcVar2 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  if (pcVar2 == (char *)0x0) {
    std::ios::clear((int)local_198 + (int)*(undefined8 *)(local_198[0] + -0x18));
  }
  else {
    sVar3 = strlen(pcVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,pcVar2,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"#extension GL_EXT_tessellation_shader : require\n",0x30);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"layout(",7);
  if (primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
    pcVar2 = "triangles";
LAB_007d029c:
    bVar1 = false;
  }
  else {
    if (primitiveType == TESSPRIMITIVETYPE_ISOLINES) {
      pcVar2 = "isolines";
      goto LAB_007d029c;
    }
    if (primitiveType == TESSPRIMITIVETYPE_QUADS) {
      pcVar2 = "quads";
      goto LAB_007d029c;
    }
    bVar1 = true;
    pcVar2 = (char *)0x0;
  }
  if (bVar1) {
    std::ios::clear((int)local_198 + (int)*(undefined8 *)(local_198[0] + -0x18));
  }
  else {
    sVar3 = strlen(pcVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,pcVar2,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,") in;\n",6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"layout(location = 0) in  highp vec4 v_patch_color[];\n",0x35);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"layout(location = 0) out highp vec4 ",0x24);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_198,(colorOutputName->_M_dataplus)._M_p,
                      colorOutputName->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,";\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,
             "// note: No need to use precise gl_Position since we do not require gapless geometry\n"
             ,0x55);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"void main (void)\n",0x11);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"{\n",2);
  if (primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,
               "    vec3 weights = vec3(pow(gl_TessCoord.x, 1.3), pow(gl_TessCoord.y, 1.3), pow(gl_TessCoord.z, 1.3));\n"
               ,0x67);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"    vec3 cweights = gl_TessCoord;\n",0x22);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,
               "    gl_Position = vec4(weights.x * gl_in[0].gl_Position.xyz + weights.y * gl_in[1].gl_Position.xyz + weights.z * gl_in[2].gl_Position.xyz, 1.0);\n"
               ,0x91);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"    ",4);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_198,(colorOutputName->_M_dataplus)._M_p,
                        colorOutputName->_M_string_length);
    lVar5 = 0x62;
    pcVar2 = 
    " = cweights.x * v_patch_color[0] + cweights.y * v_patch_color[1] + cweights.z * v_patch_color[2];\n"
    ;
  }
  else {
    if (TESSPRIMITIVETYPE_ISOLINES < primitiveType) goto LAB_007d04b7;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,
               "    vec2 normalizedCoord = (gl_TessCoord.xy * 2.0 - vec2(1.0));\n",0x40);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,
               "    vec2 normalizedWeights = normalizedCoord * (vec2(1.0) - 0.3 * cos(normalizedCoord.yx * 1.57));\n"
               ,99);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"    vec2 weights = normalizedWeights * 0.5 + vec2(0.5);\n",0x38
              );
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"    vec2 cweights = gl_TessCoord.xy;\n",0x25);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,
               "    gl_Position = mix(mix(gl_in[0].gl_Position, gl_in[1].gl_Position, weights.y), mix(gl_in[2].gl_Position, gl_in[3].gl_Position, weights.y), weights.x);\n"
               ,0x9a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"    ",4);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_198,(colorOutputName->_M_dataplus)._M_p,
                        colorOutputName->_M_string_length);
    lVar5 = 0x7e;
    pcVar2 = 
    " = mix(mix(v_patch_color[0], v_patch_color[1], cweights.y), mix(v_patch_color[2], v_patch_color[3], cweights.y), cweights.x);\n"
    ;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar2,lVar5);
LAB_007d04b7:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"}\n",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string generateTessellationEvaluationShader (const TessPrimitiveType primitiveType, const std::string& colorOutputName)
{
	std::ostringstream	src;
	src <<	glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
		<< "#extension GL_EXT_tessellation_shader : require\n"
		<< "layout(" << getTessPrimitiveTypeShaderName(primitiveType) << ") in;\n"
		<< "\n"
		<< "layout(location = 0) in  highp vec4 v_patch_color[];\n"
		<< "layout(location = 0) out highp vec4 " << colorOutputName << ";\n"
		<< "\n"
		<< "// note: No need to use precise gl_Position since we do not require gapless geometry\n"
		<< "void main (void)\n"
		<< "{\n";

	if (primitiveType == TESSPRIMITIVETYPE_TRIANGLES)
		src << "    vec3 weights = vec3(pow(gl_TessCoord.x, 1.3), pow(gl_TessCoord.y, 1.3), pow(gl_TessCoord.z, 1.3));\n"
			<< "    vec3 cweights = gl_TessCoord;\n"
			<< "    gl_Position = vec4(weights.x * gl_in[0].gl_Position.xyz + weights.y * gl_in[1].gl_Position.xyz + weights.z * gl_in[2].gl_Position.xyz, 1.0);\n"
			<< "    " << colorOutputName << " = cweights.x * v_patch_color[0] + cweights.y * v_patch_color[1] + cweights.z * v_patch_color[2];\n";
	else if (primitiveType == TESSPRIMITIVETYPE_QUADS || primitiveType == TESSPRIMITIVETYPE_ISOLINES)
		src << "    vec2 normalizedCoord = (gl_TessCoord.xy * 2.0 - vec2(1.0));\n"
			<< "    vec2 normalizedWeights = normalizedCoord * (vec2(1.0) - 0.3 * cos(normalizedCoord.yx * 1.57));\n"
			<< "    vec2 weights = normalizedWeights * 0.5 + vec2(0.5);\n"
			<< "    vec2 cweights = gl_TessCoord.xy;\n"
			<< "    gl_Position = mix(mix(gl_in[0].gl_Position, gl_in[1].gl_Position, weights.y), mix(gl_in[2].gl_Position, gl_in[3].gl_Position, weights.y), weights.x);\n"
			<< "    " << colorOutputName << " = mix(mix(v_patch_color[0], v_patch_color[1], cweights.y), mix(v_patch_color[2], v_patch_color[3], cweights.y), cweights.x);\n";
	else
		DE_ASSERT(false);

	src <<	"}\n";

	return src.str();
}